

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Bitmap.cxx
# Opt level: O0

void __thiscall
Fl_Xlib_Graphics_Driver::draw
          (Fl_Xlib_Graphics_Driver *this,Fl_Bitmap *bm,int XP,int YP,int WP,int HP,int cx,int cy)

{
  int iVar1;
  int *cy_00;
  undefined4 uVar2;
  int local_50;
  int local_4c;
  int oy;
  int ox;
  int H;
  int W;
  int Y;
  int X;
  int HP_local;
  int WP_local;
  int YP_local;
  int XP_local;
  Fl_Bitmap *bm_local;
  Fl_Xlib_Graphics_Driver *this_local;
  
  cy_00 = &cy;
  Y = HP;
  X = WP;
  HP_local = YP;
  WP_local = XP;
  _YP_local = bm;
  bm_local = (Fl_Bitmap *)this;
  iVar1 = Fl_Bitmap::start(bm,XP,YP,WP,HP,&cx,cy_00,&W,&H,&ox,&oy);
  uVar2 = (undefined4)((ulong)cy_00 >> 0x20);
  if (iVar1 == 0) {
    XSetStipple(fl_display,fl_gc,_YP_local->id_);
    local_4c = W - cx;
    if (local_4c < 0) {
      iVar1 = Fl_Image::w(&_YP_local->super_Fl_Image);
      local_4c = iVar1 + local_4c;
    }
    local_50 = H - cy;
    if (local_50 < 0) {
      iVar1 = Fl_Image::h(&_YP_local->super_Fl_Image);
      local_50 = iVar1 + local_50;
    }
    XSetTSOrigin(fl_display,fl_gc,local_4c,local_50);
    XSetFillStyle(fl_display,fl_gc,2);
    XFillRectangle(fl_display,fl_window,fl_gc,W,H,ox,CONCAT44(uVar2,oy));
    XSetFillStyle(fl_display,fl_gc,0);
  }
  return;
}

Assistant:

void Fl_Xlib_Graphics_Driver::draw(Fl_Bitmap *bm, int XP, int YP, int WP, int HP, int cx, int cy) {
  int X, Y, W, H;
  if (bm->start(XP, YP, WP, HP, cx, cy, X, Y, W, H)) {
    return;
  }
  
  XSetStipple(fl_display, fl_gc, bm->id_);
  int ox = X-cx; if (ox < 0) ox += bm->w();
  int oy = Y-cy; if (oy < 0) oy += bm->h();
  XSetTSOrigin(fl_display, fl_gc, ox, oy);
  XSetFillStyle(fl_display, fl_gc, FillStippled);
  XFillRectangle(fl_display, fl_window, fl_gc, X, Y, W, H);
  XSetFillStyle(fl_display, fl_gc, FillSolid);
}